

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O2

size_t HUF_decompress1X2_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int bmi2)

{
  undefined2 *puVar1;
  long lVar2;
  BIT_DStream_status BVar3;
  size_t sVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  undefined2 *puVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  BIT_DStream_t local_58;
  
  if (bmi2 == 0) {
    sVar4 = BIT_initDStream(&local_58,cSrc,cSrcSize);
    if (sVar4 < 0xfffffffffffffff8) {
      puVar1 = (undefined2 *)((long)dst + dstSize);
      puVar8 = (undefined2 *)((long)dst + (dstSize - 7));
      bVar5 = -(char)*(undefined2 *)((long)DTable + 2) & 0x3f;
      while ((BVar3 = BIT_reloadDStream(&local_58), dst < puVar8 &&
             (BVar3 == BIT_DStream_unfinished))) {
        uVar9 = (local_58.bitContainer << ((byte)local_58.bitsConsumed & 0x3f)) >> bVar5;
        *(short *)dst = (short)DTable[uVar9 + 1];
        iVar6 = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_58.bitsConsumed;
        uVar9 = (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7);
        uVar10 = (local_58.bitContainer << ((byte)iVar6 & 0x3f)) >> bVar5;
        *(short *)((long)dst + uVar9) = (short)DTable[uVar10 + 1];
        iVar6 = (uint)*(byte *)((long)DTable + uVar10 * 4 + 6) + iVar6;
        uVar10 = (ulong)*(byte *)((long)DTable + uVar10 * 4 + 7);
        lVar2 = uVar10 + uVar9;
        uVar11 = (local_58.bitContainer << ((byte)iVar6 & 0x3f)) >> bVar5;
        *(short *)((long)dst + uVar10 + uVar9) = (short)DTable[uVar11 + 1];
        iVar6 = (uint)*(byte *)((long)DTable + uVar11 * 4 + 6) + iVar6;
        uVar9 = (ulong)*(byte *)((long)DTable + uVar11 * 4 + 7);
        uVar10 = (local_58.bitContainer << ((byte)iVar6 & 0x3f)) >> bVar5;
        *(short *)((long)dst + uVar9 + lVar2) = (short)DTable[uVar10 + 1];
        local_58.bitsConsumed = (uint)*(byte *)((long)DTable + uVar10 * 4 + 6) + iVar6;
        dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar10 * 4 + 7) + uVar9 + lVar2);
      }
      puVar8 = puVar1 + -1;
      while ((BVar3 = BIT_reloadDStream(&local_58), dst <= puVar8 &&
             (BVar3 == BIT_DStream_unfinished))) {
        uVar9 = (local_58.bitContainer << ((byte)local_58.bitsConsumed & 0x3f)) >> bVar5;
        *(short *)dst = (short)DTable[uVar9 + 1];
        local_58.bitsConsumed = *(byte *)((long)DTable + uVar9 * 4 + 6) + local_58.bitsConsumed;
        dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7));
      }
      for (; dst <= puVar8;
          dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar9 * 4 + 7))) {
        uVar9 = (local_58.bitContainer << ((byte)local_58.bitsConsumed & 0x3f)) >> bVar5;
        *(short *)dst = (short)DTable[uVar9 + 1];
        local_58.bitsConsumed = local_58.bitsConsumed + *(byte *)((long)DTable + uVar9 * 4 + 6);
      }
      if (dst < puVar1) {
        uVar9 = (local_58.bitContainer << ((byte)local_58.bitsConsumed & 0x3f)) >> bVar5;
        *(char *)dst = (char)DTable[uVar9 + 1];
        if (*(char *)((long)DTable + uVar9 * 4 + 7) == '\x01') {
          local_58.bitsConsumed = local_58.bitsConsumed + *(byte *)((long)DTable + uVar9 * 4 + 6);
        }
        else if (local_58.bitsConsumed < 0x40) {
          uVar7 = local_58.bitsConsumed + *(byte *)((long)DTable + uVar9 * 4 + 6);
          local_58.bitsConsumed = 0x40;
          if (uVar7 < 0x40) {
            local_58.bitsConsumed = uVar7;
          }
        }
      }
      if (local_58.ptr != local_58.start) {
        dstSize = 0xfffffffffffffffc;
      }
      sVar4 = dstSize;
      if (local_58.bitsConsumed != 0x40) {
        sVar4 = 0xfffffffffffffffc;
      }
    }
    return sVar4;
  }
  sVar4 = HUF_decompress1X2_usingDTable_internal_bmi2(dst,dstSize,cSrc,cSrcSize,DTable);
  return sVar4;
}

Assistant:

HUF_DGEN(HUF_decompress1X2_usingDTable_internal)
HUF_DGEN(HUF_decompress4X2_usingDTable_internal)

size_t HUF_decompress1X2_usingDTable(
          void* dst,  size_t dstSize,
    const void* cSrc, size_t cSrcSize,
    const HUF_DTable* DTable)
{
    DTableDesc dtd = HUF_getDTableDesc(DTable);
    if (dtd.tableType != 1) return ERROR(GENERIC);
    return HUF_decompress1X2_usingDTable_internal(dst, dstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0);
}